

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O3

void __thiscall QTabWidget::initStyleOption(QTabWidget *this,QStyleOptionTabWidgetFrame *option)

{
  QTabWidgetPrivate *this_00;
  QTabBar *pQVar1;
  QWidgetData *pQVar2;
  QWidget *pQVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  QStyle *pQVar8;
  ulong uVar9;
  ulong uVar10;
  QSize QVar11;
  QSize QVar12;
  ulong uVar13;
  QRect QVar14;
  
  if (option != (QStyleOptionTabWidgetFrame *)0x0) {
    this_00 = *(QTabWidgetPrivate **)&(this->super_QWidget).field_0x8;
    QTabWidgetPrivate::initBasicStyleOption(this_00,option);
    pQVar8 = QWidget::style(&this->super_QWidget);
    uVar9 = 0;
    iVar5 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x16,0);
    uVar6 = QFrame::frameWidth(&this_00->stack->super_QFrame);
    uVar13 = (ulong)uVar6;
    bVar4 = QWidget::isVisibleTo(&this_00->tabs->super_QWidget,&this->super_QWidget);
    if (bVar4) {
      uVar9 = (**(code **)(*(long *)&this_00->tabs->super_QWidget + 0x70))();
      uVar13 = uVar9 >> 0x20;
      pQVar1 = *(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
      if (pQVar1 != (QTabBar *)0x0) {
        bVar4 = QTabBar::documentMode(pQVar1);
        if (bVar4) {
          pQVar2 = (this->super_QWidget).data;
          if ((*(uint *)(*(long *)&(this->super_QWidget).field_0x8 + 0x27c) & 0xfffffffe) == 2) {
            uVar13 = (ulong)(((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1);
          }
          else {
            uVar9 = (ulong)(((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1);
          }
        }
      }
    }
    pQVar3 = this_00->rightCornerWidget;
    if ((pQVar3 == (QWidget *)0x0) || ((pQVar3->data->widget_attributes & 0x8000) == 0)) {
      QVar11.wd.m_i = 0;
      QVar11.ht.m_i = 0;
    }
    else {
      uVar10 = (**(code **)(*(long *)pQVar3 + 0x70))();
      uVar6 = (int)uVar13 - iVar5;
      uVar7 = (uint)(uVar10 >> 0x20);
      if ((int)uVar7 < (int)uVar6) {
        uVar6 = uVar7;
      }
      QVar11 = (QSize)(uVar10 & 0xffffffff | (ulong)uVar6 << 0x20);
    }
    option->rightCornerWidgetSize = QVar11;
    pQVar3 = this_00->leftCornerWidget;
    if ((pQVar3 == (QWidget *)0x0) || ((pQVar3->data->widget_attributes & 0x8000) == 0)) {
      QVar12.wd.m_i = 0;
      QVar12.ht.m_i = 0;
    }
    else {
      uVar10 = (**(code **)(*(long *)pQVar3 + 0x70))();
      uVar6 = (int)uVar13 - iVar5;
      uVar7 = (uint)(uVar10 >> 0x20);
      if ((int)uVar7 < (int)uVar6) {
        uVar6 = uVar7;
      }
      QVar12 = (QSize)(uVar10 & 0xffffffff | (ulong)uVar6 << 0x20);
    }
    option->leftCornerWidgetSize = QVar12;
    option->tabBarSize = (QSize)(uVar9 & 0xffffffff | uVar13 << 0x20);
    pQVar1 = *(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
    iVar5 = QTabBar::currentIndex(pQVar1);
    QVar14 = QTabBar::tabRect(pQVar1,iVar5);
    uVar9._0_4_ = (option->tabBarRect).x1;
    uVar9._4_4_ = (option->tabBarRect).y1;
    uVar13 = (uVar9 & 0xffffffff00000000) + QVar14._8_8_ & 0xffffffff00000000 |
             (ulong)(uint)(QVar14.x2.m_i.m_i + (undefined4)uVar9);
    uVar9 = (ulong)(uint)((undefined4)uVar9 + QVar14.x1.m_i.m_i) |
            QVar14._0_8_ + (uVar9 & 0xffffffff00000000) & 0xffffffff00000000;
    (option->selectedTabRect).x1 = (Representation)(int)uVar9;
    (option->selectedTabRect).y1 = (Representation)(int)(uVar9 >> 0x20);
    (option->selectedTabRect).x2 = (Representation)(int)uVar13;
    (option->selectedTabRect).y2 = (Representation)(int)(uVar13 >> 0x20);
  }
  return;
}

Assistant:

void QTabWidget::initStyleOption(QStyleOptionTabWidgetFrame *option) const
{
    if (!option)
        return;

    Q_D(const QTabWidget);
    d->initBasicStyleOption(option);

    int exth = style()->pixelMetric(QStyle::PM_TabBarBaseHeight, nullptr, this);
    QSize t(0, d->stack->frameWidth());
    if (d->tabs->isVisibleTo(const_cast<QTabWidget *>(this))) {
        t = d->tabs->sizeHint();
        if (documentMode()) {
            if (tabPosition() == East || tabPosition() == West) {
                t.setHeight(height());
            } else {
                t.setWidth(width());
            }
        }
    }

    if (d->rightCornerWidget && d->rightCornerWidget->isVisible()) {
        const QSize rightCornerSizeHint = d->rightCornerWidget->sizeHint();
        const QSize bounds(rightCornerSizeHint.width(), t.height() - exth);
        option->rightCornerWidgetSize = rightCornerSizeHint.boundedTo(bounds);
    } else {
        option->rightCornerWidgetSize = QSize(0, 0);
    }

    if (d->leftCornerWidget && d->leftCornerWidget->isVisible()) {
        const QSize leftCornerSizeHint = d->leftCornerWidget->sizeHint();
        const QSize bounds(leftCornerSizeHint.width(), t.height() - exth);
        option->leftCornerWidgetSize = leftCornerSizeHint.boundedTo(bounds);
    } else {
        option->leftCornerWidgetSize = QSize(0, 0);
    }

    option->tabBarSize = t;

    QRect selectedTabRect = tabBar()->tabRect(tabBar()->currentIndex());
    selectedTabRect.moveTopLeft(selectedTabRect.topLeft() + option->tabBarRect.topLeft());
    option->selectedTabRect = selectedTabRect;
}